

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid,REF_INT *nodes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT edg_qua;
  REF_INT edg_tri;
  REF_INT qua_nodes [27];
  REF_INT tri_nodes [27];
  undefined8 in_stack_fffffffffffffed8;
  undefined4 uVar11;
  uint local_118;
  uint local_114;
  REF_INT local_110;
  REF_INT local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_98;
  uint local_94;
  uint local_90;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  uVar3 = ref_cell_list_with2(ref_grid->cell[3],*nodes,nodes[1],1,(REF_INT *)&local_114,&local_10c);
  if (uVar3 == 0) {
    uVar3 = ref_cell_list_with2(ref_grid->cell[6],*nodes,nodes[1],1,(REF_INT *)&local_118,&local_110
                               );
    if (uVar3 == 0) {
      uVar3 = local_118 + local_114;
      if (uVar3 == 1) {
        uVar3 = local_118;
        if ((int)local_114 < (int)local_118) {
          uVar3 = local_114;
        }
        if (uVar3 == 0) {
          uVar10 = 0xffffffff;
          uVar9 = 0xffffffff;
          if (local_114 == 1) {
            uVar3 = ref_cell_nodes(ref_grid->cell[3],local_10c,(REF_INT *)&local_98);
            if (uVar3 != 0) {
              pcVar7 = "tri nodes";
              uVar4 = 0x47c;
              goto LAB_00152c2d;
            }
            uVar3 = *nodes;
            uVar1 = nodes[1];
            uVar2 = uVar1;
            if ((int)uVar3 < (int)uVar1) {
              uVar2 = uVar3;
            }
            uVar6 = local_94;
            if ((int)local_98 < (int)local_94) {
              uVar6 = local_98;
            }
            uVar10 = 0xffffffff;
            uVar9 = 0xffffffff;
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar3) {
                uVar6 = uVar3;
              }
              uVar5 = local_94;
              if ((int)local_94 < (int)local_98) {
                uVar5 = local_98;
              }
              uVar10 = 0xffffffff;
              if (uVar6 == uVar5) {
                uVar10 = local_94;
              }
              uVar9 = 0xffffffff;
              if (uVar6 == uVar5) {
                uVar9 = local_98;
              }
            }
            uVar6 = local_90;
            if ((int)local_94 < (int)local_90) {
              uVar6 = local_94;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar3) {
                uVar6 = uVar3;
              }
              uVar5 = local_90;
              if ((int)local_90 < (int)local_94) {
                uVar5 = local_94;
              }
              if (uVar6 == uVar5) {
                uVar10 = local_90;
                uVar9 = local_94;
              }
            }
            uVar6 = local_98;
            if ((int)local_90 < (int)local_98) {
              uVar6 = local_90;
            }
            if (uVar2 == uVar6) {
              if ((int)uVar1 < (int)uVar3) {
                uVar1 = uVar3;
              }
              uVar3 = local_98;
              if ((int)local_98 < (int)local_90) {
                uVar3 = local_90;
              }
              if (uVar1 == uVar3) {
                uVar10 = local_98;
                uVar9 = local_90;
              }
            }
          }
          if (local_118 == 1) {
            uVar3 = ref_cell_nodes(ref_grid->cell[6],local_110,(REF_INT *)&local_108);
            if (uVar3 != 0) {
              pcVar7 = "qua nodes";
              uVar4 = 0x48f;
              goto LAB_00152c2d;
            }
            uVar3 = *nodes;
            uVar1 = nodes[1];
            uVar2 = uVar1;
            if ((int)uVar3 < (int)uVar1) {
              uVar2 = uVar3;
            }
            uVar6 = local_104;
            if ((int)local_108 < (int)local_104) {
              uVar6 = local_108;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar3) {
                uVar6 = uVar3;
              }
              uVar5 = local_104;
              if ((int)local_104 < (int)local_108) {
                uVar5 = local_108;
              }
              if (uVar6 == uVar5) {
                uVar10 = local_104;
                uVar9 = local_108;
              }
            }
            uVar6 = local_100;
            if ((int)local_104 < (int)local_100) {
              uVar6 = local_104;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar3) {
                uVar6 = uVar3;
              }
              uVar5 = local_100;
              if ((int)local_100 < (int)local_104) {
                uVar5 = local_104;
              }
              if (uVar6 == uVar5) {
                uVar10 = local_100;
                uVar9 = local_104;
              }
            }
            uVar6 = local_fc;
            if ((int)local_100 < (int)local_fc) {
              uVar6 = local_100;
            }
            if (uVar2 == uVar6) {
              uVar6 = uVar1;
              if ((int)uVar1 < (int)uVar3) {
                uVar6 = uVar3;
              }
              uVar5 = local_fc;
              if ((int)local_fc < (int)local_100) {
                uVar5 = local_100;
              }
              if (uVar6 == uVar5) {
                uVar10 = local_fc;
                uVar9 = local_100;
              }
            }
            uVar6 = local_108;
            if ((int)local_fc < (int)local_108) {
              uVar6 = local_fc;
            }
            if (uVar2 == uVar6) {
              if ((int)uVar1 < (int)uVar3) {
                uVar1 = uVar3;
              }
              uVar3 = local_108;
              if ((int)local_108 < (int)local_fc) {
                uVar3 = local_fc;
              }
              if (uVar1 == uVar3) {
                uVar10 = local_108;
                uVar9 = local_fc;
              }
            }
          }
          if (uVar9 == 0xffffffff) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4ab,"ref_grid_orient_edg","node0 not found");
            uVar4 = CONCAT44(uVar11,0xffffffff);
            printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n",(ulong)(uint)*nodes,
                   (ulong)(uint)nodes[1],(ulong)(uint)nodes[2],(ulong)local_114,(ulong)local_118,
                   uVar4,uVar10);
            if (0 < (int)local_118) {
              printf("qua %d %d %d %d %d\n",(ulong)local_108,(ulong)local_104,(ulong)local_100,
                     (ulong)local_fc,(ulong)local_f8,uVar4,uVar10);
              return 1;
            }
            return 1;
          }
          if (uVar10 == 0xffffffff) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4ac,"ref_grid_orient_edg","node1 not found");
            return 1;
          }
          *nodes = uVar9;
          nodes[1] = uVar10;
          return 0;
        }
        pcVar7 = "expect zero min tri/qua for an edge";
        uVar4 = 0x477;
        uVar8 = 0;
      }
      else {
        pcVar7 = "expect one tri/qua for an edge";
        uVar8 = 1;
        uVar4 = 0x476;
      }
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar4,
             "ref_grid_orient_edg",pcVar7,uVar8,(long)(int)uVar3);
      return 1;
    }
    pcVar7 = "qua with edge side";
    uVar4 = 0x475;
  }
  else {
    pcVar7 = "tri with edge side";
    uVar4 = 0x472;
  }
LAB_00152c2d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar4,
         "ref_grid_orient_edg",(ulong)uVar3,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_edg(REF_GRID ref_grid, REF_INT *nodes) {
  REF_INT ntri, edg_tri, nqua, edg_qua;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1;
  RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), nodes[0], nodes[1], 1, &ntri,
                          &edg_tri),
      "tri with edge side");
  RSS(ref_cell_list_with2(ref_grid_qua(ref_grid), nodes[0], nodes[1], 1, &nqua,
                          &edg_qua),
      "qua with edge side");
  REIS(1, ntri + nqua, "expect one tri/qua for an edge");
  REIS(0, MIN(ntri, nqua), "expect zero min tri/qua for an edge");
  node0 = REF_EMPTY;
  node1 = REF_EMPTY;
  if (1 == ntri) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), edg_tri, tri_nodes),
        "tri nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[0], tri_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[0], tri_nodes[1]))) {
      node0 = tri_nodes[0];
      node1 = tri_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[1], tri_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[1], tri_nodes[2]))) {
      node0 = tri_nodes[1];
      node1 = tri_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(tri_nodes[2], tri_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(tri_nodes[2], tri_nodes[0]))) {
      node0 = tri_nodes[2];
      node1 = tri_nodes[0];
    }
  }
  if (1 == nqua) {
    RSS(ref_cell_nodes(ref_grid_qua(ref_grid), edg_qua, qua_nodes),
        "qua nodes");
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[0], qua_nodes[1])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[0], qua_nodes[1]))) {
      node0 = qua_nodes[0];
      node1 = qua_nodes[1];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[1], qua_nodes[2])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[1], qua_nodes[2]))) {
      node0 = qua_nodes[1];
      node1 = qua_nodes[2];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[2], qua_nodes[3])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[2], qua_nodes[3]))) {
      node0 = qua_nodes[2];
      node1 = qua_nodes[3];
    }
    if ((MIN(nodes[0], nodes[1]) == MIN(qua_nodes[3], qua_nodes[0])) &&
        (MAX(nodes[0], nodes[1]) == MAX(qua_nodes[3], qua_nodes[0]))) {
      node0 = qua_nodes[3];
      node1 = qua_nodes[0];
    }
  }
  RUB(REF_EMPTY, node0, "node0 not found", {
    printf("nodes %d %d %d ntri %d nqua %d node0 %d node1 %d\n", nodes[0],
           nodes[1], nodes[2], ntri, nqua, node0, node1);
    if (nqua > 0)
      printf("qua %d %d %d %d %d\n", qua_nodes[0], qua_nodes[1], qua_nodes[2],
             qua_nodes[3], qua_nodes[4]);
  });
  RUS(REF_EMPTY, node1, "node1 not found");
  /* same direction as triangle or quad side */
  nodes[0] = node0;
  nodes[1] = node1;

  return REF_SUCCESS;
}